

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFromMaskedBits(unsigned_long value,unsigned_long mask,size_t byteCount)

{
  ulong uVar1;
  ulong in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar2;
  SimpleString SVar3;
  char *local_78;
  ulong local_70;
  ulong local_48;
  size_t i;
  unsigned_long msbMask;
  size_t bitCount;
  size_t byteCount_local;
  unsigned_long mask_local;
  unsigned_long value_local;
  SimpleString *result;
  
  SimpleString::SimpleString((SimpleString *)value,"");
  if (in_RCX < 9) {
    local_70 = in_RCX << 3;
  }
  else {
    local_70 = 0x40;
  }
  uVar1 = 1L << ((char)local_70 - 1U & 0x3f);
  sVar2 = extraout_RDX;
  byteCount_local = byteCount;
  mask_local = mask;
  for (local_48 = 0; local_48 < local_70; local_48 = local_48 + 1) {
    if ((byteCount_local & uVar1) == 0) {
      SimpleString::operator+=((SimpleString *)value,"x");
      sVar2 = extraout_RDX_01;
    }
    else {
      if ((mask_local & uVar1) == 0) {
        local_78 = "0";
      }
      else {
        local_78 = "1";
      }
      SimpleString::operator+=((SimpleString *)value,local_78);
      sVar2 = extraout_RDX_00;
    }
    if (((local_48 & 7) == 7) && (local_48 != local_70 - 1)) {
      SimpleString::operator+=((SimpleString *)value," ");
      sVar2 = extraout_RDX_02;
    }
    mask_local = mask_local << 1;
    byteCount_local = byteCount_local << 1;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)value;
  return SVar3;
}

Assistant:

SimpleString StringFromMaskedBits(unsigned long value, unsigned long mask, size_t byteCount)
{
    SimpleString result;
    size_t bitCount = (byteCount > sizeof(unsigned long)) ? (sizeof(unsigned long) * CPPUTEST_CHAR_BIT) : (byteCount * CPPUTEST_CHAR_BIT);
    const unsigned long msbMask = (((unsigned long) 1) << (bitCount - 1));

    for (size_t i = 0; i < bitCount; i++) {
        if (mask & msbMask) {
            result += (value & msbMask) ? "1" : "0";
        }
        else {
            result += "x";
        }

        if (((i % 8) == 7) && (i != (bitCount - 1))) {
            result += " ";
        }

        value <<= 1;
        mask <<= 1;
    }

    return result;
}